

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<void*,void*>(Capturer *this,size_t index,void **value,void **values)

{
  string local_48;
  void **local_28;
  void **values_local;
  void **value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_28 = values;
  values_local = value;
  value_local = (void **)index;
  index_local = (size_t)this;
  Detail::stringify<void*>(&local_48,(Detail *)value,value);
  captureValue(this,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  captureValues<void*>(this,(long)value_local + 1,local_28);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }